

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetFixedStepBounds(void *arkode_mem,realtype lb,realtype ub)

{
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  local_4 = arkAccessHAdaptMem((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                               ,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                               (ARKodeHAdaptMem *)0xeac94e);
  if (local_4 == 0) {
    if ((1.0 < in_XMM0_Qa) || (in_XMM1_Qa < 1.0)) {
      in_stack_ffffffffffffffd0[0x88] = '\0';
      in_stack_ffffffffffffffd0[0x89] = '\0';
      in_stack_ffffffffffffffd0[0x8a] = '\0';
      in_stack_ffffffffffffffd0[0x8b] = '\0';
      in_stack_ffffffffffffffd0[0x8c] = '\0';
      in_stack_ffffffffffffffd0[0x8d] = '\0';
      in_stack_ffffffffffffffd0[0x8e] = -0x10;
      in_stack_ffffffffffffffd0[0x8f] = '?';
      in_stack_ffffffffffffffd0[0x90] = '\0';
      in_stack_ffffffffffffffd0[0x91] = '\0';
      in_stack_ffffffffffffffd0[0x92] = '\0';
      in_stack_ffffffffffffffd0[0x93] = '\0';
      in_stack_ffffffffffffffd0[0x94] = '\0';
      in_stack_ffffffffffffffd0[0x95] = '\0';
      in_stack_ffffffffffffffd0[0x96] = -8;
      in_stack_ffffffffffffffd0[0x97] = '?';
    }
    else {
      *(double *)(in_stack_ffffffffffffffd0 + 0x88) = in_XMM0_Qa;
      *(double *)(in_stack_ffffffffffffffd0 + 0x90) = in_XMM1_Qa;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetFixedStepBounds(void *arkode_mem, realtype lb, realtype ub)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetFixedStepBounds",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* set allowable interval, otherwise set defaults */
  if ((lb <= ONE) && (ub >= ONE)) {
    hadapt_mem->lbound = lb;
    hadapt_mem->ubound = ub;
  } else {
    hadapt_mem->lbound = HFIXED_LB;
    hadapt_mem->ubound = HFIXED_UB;
  }

  return(ARK_SUCCESS);
}